

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::MultiPartOutputFile::Data::overrideSharedAttributesValues
          (Data *this,Header *src,Header *dst)

{
  TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *pTVar1;
  TypedAttribute<float> *pTVar2;
  TypedAttribute<Imf_3_4::TimeCode> *pTVar3;
  TypedAttribute<Imf_3_4::Chromaticities> *pTVar4;
  ChromaticitiesAttribute *chromaticities;
  TimeCodeAttribute *timeCode;
  FloatAttribute *pixelAspectRatio;
  Box2iAttribute *displayWindow;
  char *in_stack_000000f8;
  Header *in_stack_00000100;
  char *in_stack_00000298;
  Header *in_stack_000002a0;
  Attribute *in_stack_000005b0;
  char *in_stack_000005b8;
  Header *in_stack_000005c0;
  
  pTVar1 = Header::findTypedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>>
                     (in_stack_00000100,in_stack_000000f8);
  if (pTVar1 == (TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)0x0) {
    Header::erase(in_stack_000002a0,in_stack_00000298);
  }
  else {
    Header::insert(in_stack_000005c0,in_stack_000005b8,in_stack_000005b0);
  }
  pTVar2 = Header::findTypedAttribute<Imf_3_4::TypedAttribute<float>>
                     (in_stack_00000100,in_stack_000000f8);
  if (pTVar2 == (TypedAttribute<float> *)0x0) {
    Header::erase(in_stack_000002a0,in_stack_00000298);
  }
  else {
    Header::insert(in_stack_000005c0,in_stack_000005b8,in_stack_000005b0);
  }
  pTVar3 = Header::findTypedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>>
                     (in_stack_00000100,in_stack_000000f8);
  if (pTVar3 == (TypedAttribute<Imf_3_4::TimeCode> *)0x0) {
    Header::erase(in_stack_000002a0,in_stack_00000298);
  }
  else {
    Header::insert(in_stack_000005c0,in_stack_000005b8,in_stack_000005b0);
  }
  pTVar4 = Header::findTypedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>>
                     (in_stack_00000100,in_stack_000000f8);
  if (pTVar4 == (TypedAttribute<Imf_3_4::Chromaticities> *)0x0) {
    Header::erase(in_stack_000002a0,in_stack_00000298);
  }
  else {
    Header::insert(in_stack_000005c0,in_stack_000005b8,in_stack_000005b0);
  }
  return;
}

Assistant:

void
MultiPartOutputFile::Data::overrideSharedAttributesValues (
    const Header& src, Header& dst)
{
    //
    // Display Window
    //
    const Box2iAttribute* displayWindow =
        src.findTypedAttribute<Box2iAttribute> ("displayWindow");

    if (displayWindow)
        dst.insert ("displayWindow", *displayWindow);
    else
        dst.erase ("displayWindow");

    //
    // Pixel Aspect Ratio
    //
    const FloatAttribute* pixelAspectRatio =
        src.findTypedAttribute<FloatAttribute> ("pixelAspectRatio");

    if (pixelAspectRatio)
        dst.insert ("pixelAspectRatio", *pixelAspectRatio);
    else
        dst.erase ("pixelAspectRatio");

    //
    // Timecode
    //
    const TimeCodeAttribute* timeCode =
        src.findTypedAttribute<TimeCodeAttribute> ("timecode");

    if (timeCode)
        dst.insert ("timecode", *timeCode);
    else
        dst.erase ("timecode");

    //
    // Chromaticities
    //
    const ChromaticitiesAttribute* chromaticities =
        src.findTypedAttribute<ChromaticitiesAttribute> ("chromaticities");

    if (chromaticities)
        dst.insert ("chromaticities", *chromaticities);
    else
        dst.erase ("chromaticities");
}